

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

char * io_read_all_str(IOHANDLE io)

{
  uchar *bytes;
  ulong uVar1;
  long in_FS_OFFSET;
  uint len;
  void *buffer;
  uint local_24;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  io_read_all(io,&local_20,&local_24);
  if ((ulong)local_24 != 0) {
    uVar1 = 0;
    do {
      if (local_20[uVar1] == '\0') {
        free(local_20);
        local_20 = (char *)0x0;
        break;
      }
      uVar1 = uVar1 + 1;
    } while (local_24 != uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

char *io_read_all_str(IOHANDLE io)
{
	void *buffer;
	unsigned len;

	io_read_all(io, &buffer, &len);
	if(mem_has_null(buffer, len))
	{
		free(buffer);
		return 0;
	}
	return buffer;
}